

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O3

deUint64 __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::renderUnbatched
          (DrawCallBatchingTest *this)

{
  bool bVar1;
  code *pcVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long *plVar8;
  long *plVar9;
  pointer puVar10;
  long lVar11;
  code *pcVar12;
  long lVar13;
  long lVar14;
  GLint location;
  vector<int,_std::allocator<int>_> dynamicAttributeLocations;
  ostringstream s;
  long *local_230;
  long local_220;
  undefined4 uStack_218;
  undefined4 uStack_214;
  deUint32 local_20c;
  code *local_208;
  int local_1fc;
  long *local_1f8 [2];
  long local_1e8 [2];
  void *local_1d8;
  iterator iStack_1d0;
  int *local_1c8;
  deUint64 local_1b8;
  deUint64 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  local_1d8 = (void *)0x0;
  iStack_1d0._M_current = (int *)0x0;
  local_1c8 = (int *)0x0;
  (**(code **)(lVar7 + 0x1a00))(0,0,0x20,0x20);
  (**(code **)(lVar7 + 0x1680))((this->m_program->m_program).m_program);
  if (0 < (this->m_spec).staticAttributeCount) {
    pcVar12 = (code *)0x0;
    lVar14 = 0;
    do {
      pcVar2 = *(code **)(lVar7 + 0x780);
      dVar6 = (this->m_program->m_program).m_program;
      local_208 = pcVar12;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,(int)lVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1bdd188);
      local_230 = &local_220;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_220 = *plVar9;
        uStack_218 = (undefined4)plVar8[3];
        uStack_214 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_220 = *plVar9;
        local_230 = (long *)*plVar8;
      }
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar4 = (*pcVar2)(dVar6,local_230);
      pcVar12 = local_208;
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      (**(code **)(lVar7 + 0x610))(uVar4);
      if ((this->m_spec).useStaticBuffer == true) {
        (**(code **)(lVar7 + 0x40))
                  (0x8892,(this->m_unbatchedStaticBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar14]);
        (**(code **)(lVar7 + 0x19f0))(uVar4,4,0x1400,1,0,0);
        (**(code **)(lVar7 + 0x40))(0x8892,0);
      }
      else {
        (**(code **)(lVar7 + 0x19f0))
                  (uVar4,4,0x1400,1,0,
                   *(undefined8 *)
                    (pcVar12 +
                    (long)(this->m_staticAttributeDatas).
                          super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start));
      }
      lVar14 = lVar14 + 1;
      pcVar12 = pcVar12 + 0x18;
    } while (lVar14 < (this->m_spec).staticAttributeCount);
  }
  if (0 < (this->m_spec).dynamicAttributeCount) {
    iVar3 = 0;
    do {
      local_208 = *(code **)(lVar7 + 0x780);
      local_20c = (this->m_program->m_program).m_program;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1bdd1a8);
      local_230 = &local_220;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_220 = *plVar9;
        uStack_218 = (undefined4)plVar8[3];
        uStack_214 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_220 = *plVar9;
        local_230 = (long *)*plVar8;
      }
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      iVar5 = (*local_208)(local_20c,local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      local_1fc = iVar5;
      (**(code **)(lVar7 + 0x610))(iVar5);
      if (iStack_1d0._M_current == local_1c8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1d8,iStack_1d0,&local_1fc);
      }
      else {
        *iStack_1d0._M_current = local_1fc;
        iStack_1d0._M_current = iStack_1d0._M_current + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (this->m_spec).dynamicAttributeCount);
  }
  if ((((this->m_spec).useDrawElements != false) && ((this->m_spec).useIndexBuffer == true)) &&
     ((this->m_spec).dynamicIndices == false)) {
    (**(code **)(lVar7 + 0x40))(0x8893,this->m_unbatchedStaticIndexBuffer);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to setup initial state for rendering.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x268);
  (**(code **)(lVar7 + 0x648))();
  local_1b0 = deGetMicroseconds();
  if (0 < (this->m_spec).drawCallCount) {
    lVar14 = 0;
    do {
      if (0 < (this->m_spec).dynamicAttributeCount) {
        lVar11 = 0;
        lVar13 = 0;
        do {
          if ((this->m_spec).useDynamicBuffer == true) {
            (**(code **)(lVar7 + 0x40))
                      (0x8892,*(undefined4 *)
                               (*(long *)((long)&(((this->m_unbatchedDynamicBuffers).
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar11
                                         ) + lVar14 * 4));
            (**(code **)(lVar7 + 0x19f0))
                      (*(undefined4 *)((long)local_1d8 + lVar13 * 4),4,0x1400,1,0,0);
            (**(code **)(lVar7 + 0x40))(0x8892,0);
          }
          else {
            (**(code **)(lVar7 + 0x19f0))
                      (*(undefined4 *)((long)local_1d8 + lVar13 * 4),4,0x1400,1,0,
                       (long)((this->m_spec).triangleCount * (int)lVar14 * 0xc) +
                       *(long *)((long)&(((this->m_dynamicAttributeDatas).
                                          super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar11));
          }
          lVar13 = lVar13 + 1;
          lVar11 = lVar11 + 0x18;
        } while (lVar13 < (this->m_spec).dynamicAttributeCount);
      }
      if ((this->m_spec).useDrawElements == false) {
        (**(code **)(lVar7 + 0x538))(4,0,(this->m_spec).triangleCount * 3);
      }
      else {
        bVar1 = (this->m_spec).dynamicIndices;
        if ((this->m_spec).useIndexBuffer == true) {
          if (bVar1 == false) {
            (**(code **)(lVar7 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401,0);
          }
          else {
            (**(code **)(lVar7 + 0x40))
                      (0x8893,(this->m_unbatchedDynamicIndexBuffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar14]);
            (**(code **)(lVar7 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401,0);
            (**(code **)(lVar7 + 0x40))(0x8893);
          }
        }
        else {
          iVar3 = (this->m_spec).triangleCount;
          if (bVar1 == false) {
            puVar10 = (this->m_staticIndexData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            puVar10 = (this->m_dynamicIndexData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + (int)lVar14 * iVar3 * 3;
          }
          (**(code **)(lVar7 + 0x568))(4,iVar3 * 3,0x1401,puVar10);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_spec).drawCallCount);
  }
  (**(code **)(lVar7 + 0x648))();
  local_1b8 = deGetMicroseconds();
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Unbatched rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x299);
  (**(code **)(lVar7 + 0x40))(0x8893,0);
  if (0 < (this->m_spec).staticAttributeCount) {
    iVar3 = 0;
    do {
      local_208 = *(code **)(lVar7 + 0x780);
      local_20c = (this->m_program->m_program).m_program;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1bdd188);
      local_230 = &local_220;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_220 = *plVar9;
        uStack_218 = (undefined4)plVar8[3];
        uStack_214 = *(undefined4 *)((long)plVar8 + 0x1c);
      }
      else {
        local_220 = *plVar9;
        local_230 = (long *)*plVar8;
      }
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar4 = (*local_208)(local_20c,local_230);
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      (**(code **)(lVar7 + 0x518))(uVar4);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (this->m_spec).staticAttributeCount);
  }
  if (0 < (this->m_spec).dynamicAttributeCount) {
    lVar14 = 0;
    do {
      (**(code **)(lVar7 + 0x518))(*(undefined4 *)((long)local_1d8 + lVar14 * 4));
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_spec).dynamicAttributeCount);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to reset state after unbatched rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x2a6);
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8,(long)local_1c8 - (long)local_1d8);
  }
  return local_1b8 - local_1b0;
}

Assistant:

deUint64 DrawCallBatchingTest::renderUnbatched (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	deUint64				beginUs	= 0;
	deUint64				endUs	= 0;
	vector<GLint>			dynamicAttributeLocations;

	gl.viewport(0, 0, 32, 32);
	gl.useProgram(m_program->getProgram());

	// Setup static buffers
	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);

		if (m_spec.useStaticBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedStaticBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, &(m_staticAttributeDatas[attribNdx][0]));
	}

	// Get locations of dynamic attributes
	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_dyn" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);
		dynamicAttributeLocations.push_back(location);
	}

	if (m_spec.useDrawElements && m_spec.useIndexBuffer && !m_spec.dynamicIndices)
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedStaticIndexBuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup initial state for rendering.");

	gl.finish();

	beginUs = deGetMicroseconds();

	for (int drawNdx = 0; drawNdx < m_spec.drawCallCount; drawNdx++)
	{
		for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		{
			if (m_spec.useDynamicBuffer)
			{
				gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedDynamicBuffers[attribNdx][drawNdx]);
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, NULL);
				gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			}
			else
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, &(m_dynamicAttributeDatas[attribNdx][m_spec.triangleCount * 3 * drawNdx * 4]));
		}

		if (m_spec.useDrawElements)
		{
			if (m_spec.useIndexBuffer)
			{
				if (m_spec.dynamicIndices)
				{
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedDynamicIndexBuffers[drawNdx]);
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
				}
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
			}
			else
			{
				if (m_spec.dynamicIndices)
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_dynamicIndexData[drawNdx * m_spec.triangleCount * 3]));
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_staticIndexData[0]));
			}
		}
		else
			gl.drawArrays(GL_TRIANGLES, 0, 3 * m_spec.triangleCount);
	}

	gl.finish();

	endUs = deGetMicroseconds();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Unbatched rendering failed");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());
		gl.disableVertexAttribArray(location);
	}

	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		gl.disableVertexAttribArray(dynamicAttributeLocations[attribNdx]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to reset state after unbatched rendering");

	return endUs - beginUs;
}